

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorwiseOp.h
# Opt level: O3

void __thiscall
Eigen::VectorwiseOp<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::normalize
          (VectorwiseOp<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1> *this)

{
  PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *this_00;
  long lVar1;
  long lVar2;
  double *pdVar3;
  Index innerSize;
  undefined8 *puVar4;
  double *pdVar5;
  long lVar6;
  Index col;
  long lVar7;
  Index row;
  long lVar8;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,_const_Eigen::Replicate<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_Eigen::internal::member_norm<double>,_1>,_1,_3>_>
  local_40;
  
  normalized(&local_40,this);
  if (0x2aaaaaaaaaaaaaaa <
      local_40.m_rhs.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = std::streambuf::xsgetn;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  this_00 = &this->m_matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>;
  PlainObjectBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::resize
            (this_00,local_40.m_rhs.m_matrix.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             ,3);
  lVar1 = (this_00->m_storage).m_rows;
  if (lVar1 == local_40.m_rhs.m_matrix.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    pdVar5 = (this_00->m_storage).m_data;
    lVar6 = 0;
    lVar7 = 0;
    do {
      if (0 < lVar1) {
        lVar2 = ((local_40.m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).
                m_storage.m_rows;
        pdVar3 = ((local_40.m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).
                 m_storage.m_data;
        lVar8 = 0;
        do {
          pdVar5[lVar8] =
               *(double *)((long)pdVar3 + lVar8 * 8 + lVar2 * lVar6) /
               local_40.m_rhs.m_matrix.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
               [lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar1 != lVar8);
      }
      lVar7 = lVar7 + 1;
      pdVar5 = pdVar5 + lVar1;
      lVar6 = lVar6 + 8;
    } while (lVar7 != 3);
    free(local_40.m_rhs.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
         m_storage.m_data);
    return;
  }
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Assign.h"
                ,0x1f2,
                "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 3>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 3>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Matrix<double, -1, 3>, const Eigen::Replicate<Eigen::PartialReduxExpr<Eigen::Matrix<double, -1, 3>, Eigen::internal::member_norm<double>, 1>, 1, 3>>]"
               );
}

Assistant:

void normalize() {
      m_matrix = this->normalized();
    }